

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expressiontoken.cpp
# Opt level: O1

bool __thiscall PDA::Transducer::ExpressionToken::isOperation(ExpressionToken *this)

{
  return (bool)((byte)(0xac2000000000 >> ((byte)this->m_charToken & 0x3f)) &
               (uint)this->m_charToken < 0x30);
}

Assistant:

bool ExpressionToken::isOperation() const
{
    if (m_charToken == L'-' || m_charToken == L'+' || m_charToken == L'/' || m_charToken == L'*' || m_charToken == L'%')
        return true;
    else
        return false;
}